

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateCachedTypeWithoutPropertyCheck
          (Lowerer *this,Instr *instrInsert,PropertySymOpnd *propertySymOpnd,Opnd *typeOpnd,
          LabelInstr *labelTypeCheckFailed)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar1;
  undefined4 offset;
  bool bVar2;
  TypeId typeId;
  uint32 offset_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  JITType *pJVar7;
  RegOpnd *pRVar8;
  IndirOpnd *src;
  PropertyGuard *this_01;
  size_t sVar9;
  Func *pFVar10;
  StackSym *pSVar11;
  intptr_t *pMemLoc;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  JITTimeWorkItem *this_02;
  FunctionJITTimeInfo *this_03;
  char16_t *pcVar14;
  intptr_t iVar15;
  PropertySym *pPVar16;
  WCHAR local_468 [4];
  WCHAR prefixValue [512];
  int typeCheckGuardOffset;
  bool emitDirectCheck;
  Opnd *expectedTypeOpnd;
  JitTypePropertyGuard *typePropertyGuard;
  Opnd *opnd;
  RegOpnd *baseOpnd;
  JITTypeHolder typeWithoutProperty;
  LabelInstr *labelTypeCheckFailed_local;
  Opnd *typeOpnd_local;
  PropertySymOpnd *propertySymOpnd_local;
  Instr *instrInsert_local;
  Lowerer *this_local;
  
  typeWithoutProperty.t = (Type)labelTypeCheckFailed;
  bVar2 = IR::PropertySymOpnd::IsMonoObjTypeSpecCandidate(propertySymOpnd);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1e9c,"(propertySymOpnd->IsMonoObjTypeSpecCandidate())",
                       "propertySymOpnd->IsMonoObjTypeSpecCandidate()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = IR::PropertySymOpnd::HasInitialType(propertySymOpnd);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1e9d,"(propertySymOpnd->HasInitialType())",
                       "propertySymOpnd->HasInitialType()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  baseOpnd = (RegOpnd *)IR::PropertySymOpnd::GetInitialType(propertySymOpnd);
  pJVar7 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&baseOpnd);
  typeId = JITType::GetTypeId(pJVar7);
  bVar2 = Js::DynamicType::Is(typeId);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ea2,"(Js::DynamicType::Is(typeWithoutProperty->GetTypeId()))",
                       "Js::DynamicType::Is(typeWithoutProperty->GetTypeId())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  labelTypeCheckFailed_local = (LabelInstr *)typeOpnd;
  if (typeOpnd == (Opnd *)0x0) {
    pRVar8 = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,this->m_func);
    bVar2 = IR::Opnd::IsNotTaggedValue(&pRVar8->super_Opnd);
    if (!bVar2) {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&pRVar8->super_Opnd,instrInsert,
                 (LabelInstr *)typeWithoutProperty.t,false);
    }
    offset_00 = Js::RecyclableObject::GetOffsetOfType();
    src = IR::IndirOpnd::New(pRVar8,offset_00,TyInt64,this->m_func,false);
    labelTypeCheckFailed_local = (LabelInstr *)IR::RegOpnd::New(TyInt64,this->m_func);
    InsertMove((Opnd *)labelTypeCheckFailed_local,&src->super_Opnd,instrInsert,true);
  }
  this_01 = (PropertyGuard *)
            CreateTypePropertyGuardForGuardedProperties
                      (this,(JITTypeHolder)baseOpnd,propertySymOpnd);
  if (this_01 == (PropertyGuard *)0x0) {
    pJVar7 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&baseOpnd);
    iVar15 = JITType::GetAddr(pJVar7);
    _typeCheckGuardOffset =
         (IndirOpnd *)IR::AddrOpnd::New(iVar15,AddrOpndKindDynamicType,this->m_func,true,(Var)0x0);
  }
  else {
    prefixValue[0x1ff]._1_1_ = 1;
    if (this_01 == (PropertyGuard *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1eb9,"(typePropertyGuard != nullptr)","typePropertyGuard != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    sVar9 = Js::PropertyGuard::GetSizeOfValue();
    if (sVar9 != 8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1eba,
                         "(Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr]))"
                         ,
                         "Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr])"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = Func::IsOOPJIT(this->m_func);
    if (bVar2) {
      prefixValue._1016_4_ = NativeCodeData::GetDataTotalOffset(this_01);
      pFVar10 = Func::GetTopFunc(this->m_func);
      pSVar11 = Func::GetNativeCodeDataSym(pFVar10);
      pRVar8 = IR::RegOpnd::New(pSVar11,TyVar,this->m_func);
      offset = prefixValue._1016_4_;
      pcVar13 = NativeCodeData::GetDataDescription(this_01,this->m_func->m_alloc);
      _typeCheckGuardOffset = IR::IndirOpnd::New(pRVar8,offset,TyUint64,pcVar13,this->m_func,true);
      this_00 = this->addToLiveOnBackEdgeSyms;
      pFVar10 = Func::GetTopFunc(this->m_func);
      pSVar11 = Func::GetNativeCodeDataSym(pFVar10);
      BVSparse<Memory::JitArenaAllocator>::Set(this_00,(pSVar11->super_Sym).m_id);
    }
    else {
      pMemLoc = Js::PropertyGuard::GetAddressOfValue(this_01);
      _typeCheckGuardOffset =
           (IndirOpnd *)
           IR::MemRefOpnd::New(pMemLoc,TyUint64,this->m_func,AddrOpndKindDynamicGuardValueRef);
    }
    prefixValue[0x1ff]._1_1_ = 0;
    if ((DAT_01ec73ca & 1) != 0) {
      uVar3 = Func::GetSourceContextId(this->m_func);
      uVar4 = Func::GetLocalFunctionId(this->m_func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar3,uVar4);
      if (bVar2) {
        pJVar12 = Func::GetJITFunctionBody(this->m_func);
        pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pJVar12 = Func::GetJITFunctionBody(this->m_func);
        uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
        this_02 = Func::GetWorkItem(this->m_func);
        this_03 = JITTimeWorkItem::GetJITTimeInfo(this_02);
        uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
        pJVar12 = Func::GetJITFunctionBody(this->m_func);
        uVar5 = JITTimeFunctionBody::GetFunctionNumber(pJVar12);
        swprintf_s<512ul>((WCHAR (*) [512])local_468,L"%s (#%d.%u, #%u)",pcVar13,(ulong)uVar3,
                          (ulong)uVar4,(ulong)uVar5);
        pcVar14 = L"indirect";
        if ((prefixValue[0x1ff]._1_1_ & 1) != 0) {
          pcVar14 = L"direct";
        }
        pJVar7 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&baseOpnd);
        iVar15 = JITType::GetAddr(pJVar7);
        Output::TraceWithPrefix
                  (ObjTypeSpecPhase,local_468,L"Emitted %s type check for type 0x%p.\n",pcVar14,
                   iVar15);
      }
    }
  }
  InsertCompareBranch(this,(Opnd *)labelTypeCheckFailed_local,&_typeCheckGuardOffset->super_Opnd,
                      BrNeq_A,(LabelInstr *)typeWithoutProperty.t,instrInsert,false);
  pRVar8 = baseOpnd;
  pPVar16 = Sym::AsPropertySym((propertySymOpnd->super_SymOpnd).m_sym);
  PinTypeRef(this,(JITTypeHolder)pRVar8,pRVar8,instrInsert,pPVar16->m_propertyId);
  return;
}

Assistant:

void
Lowerer::GenerateCachedTypeWithoutPropertyCheck(IR::Instr *instrInsert, IR::PropertySymOpnd *propertySymOpnd, IR::Opnd *typeOpnd, IR::LabelInstr *labelTypeCheckFailed)
{
    Assert(propertySymOpnd->IsMonoObjTypeSpecCandidate());
    Assert(propertySymOpnd->HasInitialType());

    JITTypeHolder typeWithoutProperty = propertySymOpnd->GetInitialType();

    // We should never add properties to objects of static types.
    Assert(Js::DynamicType::Is(typeWithoutProperty->GetTypeId()));

    if (typeOpnd == nullptr)
    {
        // No opnd holding the type was passed in, so we have to load the type here.
        IR::RegOpnd *baseOpnd = propertySymOpnd->CreatePropertyOwnerOpnd(m_func);
        if (!baseOpnd->IsNotTaggedValue())
        {
            m_lowererMD.GenerateObjectTest(baseOpnd, instrInsert, labelTypeCheckFailed);
        }
        IR::Opnd *opnd = IR::IndirOpnd::New(baseOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
        typeOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
        InsertMove(typeOpnd, opnd, instrInsert);
    }

    Js::JitTypePropertyGuard* typePropertyGuard = CreateTypePropertyGuardForGuardedProperties(typeWithoutProperty, propertySymOpnd);

    IR::Opnd *expectedTypeOpnd;

    if (typePropertyGuard)
    {
        bool emitDirectCheck = true;

        Assert(typePropertyGuard != nullptr);
        Assert(Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr]));

        if (this->m_func->IsOOPJIT())
        {
            int typeCheckGuardOffset = NativeCodeData::GetDataTotalOffset(typePropertyGuard);
            expectedTypeOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(m_func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), typeCheckGuardOffset, TyMachPtr,
#if DBG
                NativeCodeData::GetDataDescription(typePropertyGuard, this->m_func->m_alloc),
#endif
                this->m_func, true);

            this->addToLiveOnBackEdgeSyms->Set(m_func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            expectedTypeOpnd = IR::MemRefOpnd::New((void*)(typePropertyGuard->GetAddressOfValue()), TyMachPtr, this->m_func, IR::AddrOpndKindDynamicGuardValueRef);
        }

        emitDirectCheck = false;

        OUTPUT_VERBOSE_TRACE_FUNC(Js::ObjTypeSpecPhase, this->m_func, _u("Emitted %s type check for type 0x%p.\n"),
            emitDirectCheck ? _u("direct") : _u("indirect"), typeWithoutProperty->GetAddr());
    }
    else
    {
        expectedTypeOpnd = IR::AddrOpnd::New(typeWithoutProperty->GetAddr(), IR::AddrOpndKindDynamicType, m_func, true);
    }

    InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelTypeCheckFailed, instrInsert);

    // Technically, it should be enough to pin the final type, because it should keep all of its predecessors alive, but
    // just to be extra cautious, let's pin the initial type as well.
    PinTypeRef(typeWithoutProperty, typeWithoutProperty.t, instrInsert, propertySymOpnd->m_sym->AsPropertySym()->m_propertyId);
}